

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O3

bool __thiscall crnlib::data_stream::read_line(data_stream *this,dynamic_string *str)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  byte local_19;
  
  dynamic_string::empty(str);
  iVar2 = (*this->_vptr_data_stream[4])(this,&local_19,1);
  bVar3 = this->field_0x1a;
  this->field_0x1a = bVar3 & 0xfb;
  if (iVar2 == 1) {
    do {
      if (local_19 < 0xd) {
        if (local_19 != 0) {
          if (local_19 != 10) goto LAB_001108af;
          if ((bVar3 & 4) == 0) goto LAB_001108e9;
        }
      }
      else if (local_19 != 0x1a) {
        if (local_19 == 0xd) {
          this->field_0x1a = bVar3 | 4;
          goto LAB_001108e9;
        }
LAB_001108af:
        dynamic_string::append_char(str,local_19);
      }
      iVar2 = (*this->_vptr_data_stream[4])(this,&local_19,1);
      bVar3 = this->field_0x1a;
      this->field_0x1a = bVar3 & 0xfb;
    } while (iVar2 == 1);
  }
  if (str->m_len == 0) {
    bVar1 = false;
  }
  else {
LAB_001108e9:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool data_stream::read_line(dynamic_string& str) {
  str.empty();

  for (;;) {
    const int c = read_byte();

    const bool prev_got_cr = m_got_cr;
    m_got_cr = false;

    if (c < 0) {
      if (!str.is_empty())
        break;

      return false;
    } else if ((26 == c) || (!c))
      continue;
    else if (13 == c) {
      m_got_cr = true;
      break;
    } else if (10 == c) {
      if (prev_got_cr)
        continue;

      break;
    }

    str.append_char(static_cast<char>(c));
  }

  return true;
}